

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O2

void emit_loadi(ASMState *as,Reg r,int32_t i)

{
  byte *pbVar1;
  
  pbVar1 = as->mcp;
  if ((i == 0) && ((*pbVar1 == 0xf || ((*pbVar1 & 0xf0) != 0x70)))) {
    emit_rr(as,0x330000fe,r,r);
    return;
  }
  *(int32_t *)(pbVar1 + -4) = i;
  pbVar1[-5] = (byte)r & 7 | 0xb8;
  if ((r & 8) == 0) {
    pbVar1 = pbVar1 + -5;
  }
  else {
    pbVar1[-6] = 0x41;
    pbVar1 = pbVar1 + -6;
  }
  as->mcp = pbVar1;
  return;
}

Assistant:

static void emit_loadi(ASMState *as, Reg r, int32_t i)
{
  /* XOR r,r is shorter, but modifies the flags. This is bad for HIOP/jcc. */
  if (i == 0 && !(LJ_32 && (IR(as->curins)->o == IR_HIOP ||
			    (as->curins+1 < as->T->nins &&
			     IR(as->curins+1)->o == IR_HIOP))) &&
		!((*as->mcp == 0x0f && (as->mcp[1] & 0xf0) == XI_JCCn) ||
		  (*as->mcp & 0xf0) == XI_JCCs)) {
    emit_rr(as, XO_ARITH(XOg_XOR), r, r);
  } else {
    MCode *p = as->mcp;
    *(int32_t *)(p-4) = i;
    p[-5] = (MCode)(XI_MOVri+(r&7));
    p -= 5;
    REXRB(p, 0, r);
    as->mcp = p;
  }
}